

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

Value __thiscall
Fossilize::uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (Fossilize *this,uint64_t value,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc)

{
  undefined8 extraout_RDX;
  Value VVar1;
  char str [17];
  Ch aCStack_38 [32];
  
  sprintf(aCStack_38,"%016lx",value);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,aCStack_38,alloc);
  VVar1.data_.s.str = (Ch *)extraout_RDX;
  VVar1.data_.n = (Number)this;
  return (Value)VVar1.data_;
}

Assistant:

static Value uint64_string(uint64_t value, Allocator &alloc)
{
	char str[17]; // 16 digits + null
	sprintf(str, "%016" PRIx64, value);
	return Value(str, alloc);
}